

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_texture2d *
rf_gen_texture_prefilter
          (rf_texture2d *__return_storage_ptr__,rf_shader shader,rf_texture2d cubemap,rf_int size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  rf_shader shader_00;
  int iVar14;
  long lVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  rf_shader *prVar19;
  undefined8 *puVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  rf_int mip;
  float fVar24;
  uint rbo;
  uint fbo;
  rf_float16 buffer;
  rf_mat fbo_views [6];
  undefined4 in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd0c;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  undefined8 in_stack_fffffffffffffd18;
  undefined1 in_stack_fffffffffffffd20 [104];
  uint local_230;
  uint local_22c;
  rf_int local_228;
  rf_texture2d *local_220;
  float local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  float local_1d8 [4];
  undefined1 local_1c8 [16];
  rf_mat local_1b8;
  rf_mat local_178;
  rf_mat local_138;
  rf_mat local_f8;
  rf_mat local_b8;
  rf_mat local_78;
  
  __return_storage_ptr__->id = 0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->mipmaps = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  prVar19 = &shader;
  puVar20 = (undefined8 *)&stack0xfffffffffffffd08;
  for (lVar15 = 0x10; lVar15 != 0; lVar15 = lVar15 + -1) {
    *puVar20 = *(undefined8 *)prVar19;
    prVar19 = (rf_shader *)(prVar19->locs + 1);
    puVar20 = puVar20 + 1;
  }
  shader_00.locs[0] = in_stack_fffffffffffffd0c;
  shader_00.id = in_stack_fffffffffffffd08;
  shader_00.locs[1] = in_stack_fffffffffffffd10;
  shader_00.locs[2] = in_stack_fffffffffffffd14;
  shader_00.locs[3] = (int)in_stack_fffffffffffffd18;
  shader_00.locs[4] = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  shader_00.locs[5] = in_stack_fffffffffffffd20._0_4_;
  shader_00.locs[6] = in_stack_fffffffffffffd20._4_4_;
  shader_00.locs[7] = in_stack_fffffffffffffd20._8_4_;
  shader_00.locs[8] = in_stack_fffffffffffffd20._12_4_;
  shader_00.locs[9] = in_stack_fffffffffffffd20._16_4_;
  shader_00.locs[10] = in_stack_fffffffffffffd20._20_4_;
  shader_00.locs[0xb] = in_stack_fffffffffffffd20._24_4_;
  shader_00.locs[0xc] = in_stack_fffffffffffffd20._28_4_;
  shader_00.locs[0xd] = in_stack_fffffffffffffd20._32_4_;
  shader_00.locs[0xe] = in_stack_fffffffffffffd20._36_4_;
  shader_00.locs[0xf] = in_stack_fffffffffffffd20._40_4_;
  shader_00.locs[0x10] = in_stack_fffffffffffffd20._44_4_;
  shader_00.locs[0x11] = in_stack_fffffffffffffd20._48_4_;
  shader_00.locs[0x12] = in_stack_fffffffffffffd20._52_4_;
  shader_00.locs[0x13] = in_stack_fffffffffffffd20._56_4_;
  shader_00.locs[0x14] = in_stack_fffffffffffffd20._60_4_;
  shader_00.locs[0x15] = in_stack_fffffffffffffd20._64_4_;
  shader_00.locs[0x16] = in_stack_fffffffffffffd20._68_4_;
  shader_00.locs[0x17] = in_stack_fffffffffffffd20._72_4_;
  shader_00.locs[0x18] = in_stack_fffffffffffffd20._76_4_;
  shader_00.locs[0x19] = in_stack_fffffffffffffd20._80_4_;
  shader_00.locs[0x1a] = in_stack_fffffffffffffd20._84_4_;
  shader_00.locs[0x1b] = in_stack_fffffffffffffd20._88_4_;
  shader_00.locs[0x1c] = in_stack_fffffffffffffd20._92_4_;
  shader_00.locs[0x1d] = in_stack_fffffffffffffd20._96_4_;
  shader_00.locs[0x1e] = in_stack_fffffffffffffd20._100_4_;
  shader_00.locs[0x1f] = shader.locs[0x1f];
  iVar14 = rf_gfx_get_shader_location(shader_00,"roughness");
  (*(rf__ctx->field_0).gfx_ctx.gl.GenFramebuffers)(1,&local_22c);
  (*(rf__ctx->field_0).gfx_ctx.gl.GenRenderbuffers)(1,&local_230);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,local_22c);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindRenderbuffer)(0x8d41,local_230);
  iVar21 = (int)size;
  (*(rf__ctx->field_0).gfx_ctx.gl.RenderbufferStorage)(0x8d41,0x81a6,iVar21,iVar21);
  (*(rf__ctx->field_0).gfx_ctx.gl.FramebufferRenderbuffer)(0x8d40,0x8d00,0x8d41,local_230);
  (*(rf__ctx->field_0).gfx_ctx.gl.GenTextures)(1,&__return_storage_ptr__->id);
  local_220 = __return_storage_ptr__;
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0x8513,__return_storage_ptr__->id);
  uVar16 = 0x8515;
  do {
    (*(rf__ctx->field_0).gfx_ctx.gl.TexImage2D)
              (uVar16,0,0x881b,iVar21,iVar21,0,0x1907,0x1406,(void *)0x0);
    uVar16 = uVar16 + 1;
  } while (uVar16 != 0x851b);
  local_228 = size;
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2802,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2803,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x8072,0x812f);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2801,0x2703);
  (*(rf__ctx->field_0).gfx_ctx.gl.TexParameteri)(0x8513,0x2800,0x2601);
  (*(rf__ctx->field_0).gfx_ctx.gl.GenerateMipmap)(0x8513);
  rf_mat_look_at(&local_1b8,(rf_vec3)ZEXT812(0),(rf_vec3)ZEXT412(0x3f800000),
                 (rf_vec3)ZEXT812(0xbf80000000000000));
  rf_mat_look_at(&local_178,(rf_vec3)ZEXT812(0),(rf_vec3)ZEXT412(0xbf800000),
                 (rf_vec3)ZEXT812(0xbf80000000000000));
  rf_mat_look_at(&local_138,(rf_vec3)ZEXT812(0),(rf_vec3)ZEXT812(0x3f80000000000000),
                 (rf_vec3)(ZEXT412(0x3f800000) << 0x40));
  rf_mat_look_at(&local_f8,(rf_vec3)ZEXT812(0),(rf_vec3)ZEXT812(0xbf80000000000000),
                 (rf_vec3)(ZEXT412(0xbf800000) << 0x40));
  rf_mat_look_at(&local_b8,(rf_vec3)ZEXT812(0),(rf_vec3)(ZEXT412(0x3f800000) << 0x40),
                 (rf_vec3)ZEXT812(0xbf80000000000000));
  rf_mat_look_at(&local_78,(rf_vec3)ZEXT812(0),(rf_vec3)(ZEXT412(0xbf800000) << 0x40),
                 (rf_vec3)ZEXT812(0xbf80000000000000));
  uVar16 = shader.id;
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(shader.id);
  (*(rf__ctx->field_0).gfx_ctx.gl.ActiveTexture)(0x84c0);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindTexture)(0x8513,cubemap.id);
  iVar21 = shader.locs[9];
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(uVar16);
  local_218 = 1.0;
  uStack_214 = 0;
  uStack_210 = 0;
  uStack_20c = 0;
  local_208 = 0;
  uStack_204 = 0x3f800000;
  uStack_200 = 0;
  local_1f8 = 0;
  uStack_1f0 = 0xbf800000bf8000a8;
  local_1e8 = 0;
  uStack_1e0 = 0xbca3d776;
  lVar15 = 0;
  (*(rf__ctx->field_0).gfx_ctx.gl.UniformMatrix4fv)(iVar21,1,'\0',&local_218);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,local_22c);
  iVar21 = shader.locs[8];
  do {
    local_1c8 = ZEXT416((uint)(float)lVar15);
    local_1d8[0] = -(float)lVar15;
    local_1d8[1] = -0.0;
    local_1d8[2] = -0.0;
    local_1d8[3] = -0.0;
    fVar24 = exp2f(local_1d8[0]);
    iVar22 = (int)local_228;
    iVar17 = (int)fVar24 * iVar22;
    fVar24 = exp2f(local_1d8[0]);
    iVar22 = (int)fVar24 * iVar22;
    (*(rf__ctx->field_0).gfx_ctx.gl.BindRenderbuffer)(0x8d41,local_230);
    (*(rf__ctx->field_0).gfx_ctx.gl.RenderbufferStorage)(0x8d41,0x81a6,iVar17,iVar22);
    (*(rf__ctx->field_0).gfx_ctx.gl.Viewport)(0,0,iVar17,iVar22);
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform1f)(iVar14,(float)local_1c8._0_4_ * 0.25);
    lVar23 = 0x3c;
    uVar18 = 0x8515;
    do {
      fVar24 = *(float *)((long)&local_1f8 + lVar23 + 4);
      uVar1 = *(undefined4 *)((long)&uStack_1f0 + lVar23);
      local_1d8[0] = *(float *)((long)&uStack_1f0 + lVar23 + 4);
      local_1c8._0_4_ = *(undefined4 *)((long)&local_1e8 + lVar23);
      uVar2 = *(undefined4 *)((long)&local_1e8 + lVar23 + 4);
      uVar3 = *(undefined4 *)((long)&uStack_1e0 + lVar23);
      uVar4 = *(undefined4 *)((long)&uStack_1e0 + lVar23 + 4);
      uVar5 = *(undefined4 *)((long)local_1d8 + lVar23);
      uVar6 = *(undefined4 *)((long)local_1d8 + lVar23 + 4);
      uVar7 = *(undefined4 *)((long)local_1d8 + lVar23 + 8);
      uVar8 = *(undefined4 *)(local_1c8 + lVar23 + -4);
      uVar9 = *(undefined4 *)(local_1c8 + lVar23);
      uVar10 = *(undefined4 *)(local_1c8 + lVar23 + 4);
      uVar11 = *(undefined4 *)(local_1c8 + lVar23 + 8);
      uVar12 = *(undefined4 *)(local_1c8 + lVar23 + 0xc);
      uVar13 = *(undefined4 *)((long)&local_1b8.m0 + lVar23);
      (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(uVar16);
      uStack_200 = CONCAT44(uVar11,uVar7);
      local_1f8 = CONCAT44(uVar4,local_1d8[0]);
      uStack_1f0 = CONCAT44(uVar12,uVar8);
      local_1e8 = CONCAT44(uVar5,local_1c8._0_4_);
      uStack_1e0 = CONCAT44(uVar13,uVar9);
      local_218 = fVar24;
      uStack_214 = uVar2;
      uStack_210 = uVar6;
      uStack_20c = uVar10;
      local_208 = uVar1;
      uStack_204 = uVar3;
      (*(rf__ctx->field_0).gfx_ctx.gl.UniformMatrix4fv)(iVar21,1,'\0',&local_218);
      (*(rf__ctx->field_0).gfx_ctx.gl.FramebufferTexture2D)
                (0x8d40,0x8ce0,uVar18,local_220->id,(int)lVar15);
      (*(rf__ctx->field_0).gfx_ctx.gl.Clear)(0x4100);
      rf_gen_draw_cube();
      lVar23 = lVar23 + 0x40;
      uVar18 = uVar18 + 1;
    } while (lVar23 != 0x1bc);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 5);
  (*(rf__ctx->field_0).gfx_ctx.gl.BindFramebuffer)(0x8d40,0);
  (*(rf__ctx->field_0).gfx_ctx.gl.Viewport)
            (0,0,(rf__ctx->field_0).framebuffer_width,(rf__ctx->field_0).framebuffer_height);
  local_220->width = (int)local_228;
  local_220->height = (int)local_228;
  return local_220;
}

Assistant:

RF_API rf_texture2d rf_gen_texture_prefilter(rf_shader shader, rf_texture2d cubemap, rf_int size)
{
    rf_texture2d prefilter = { 0 };

    // NOTE: rf_set_shader_default_locations() already setups locations for projection and view rf_mat in shader
    // Other locations should be setup externally in shader before calling the function
    // TODO: Locations should be taken out of this function... too shader dependant...
    int roughness_loc = rf_gfx_get_shader_location(shader, "roughness");

    // Setup framebuffer
    unsigned int fbo, rbo;
    rf_gl.GenFramebuffers(1, &fbo);
    rf_gl.GenRenderbuffers(1, &rbo);
    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, fbo);
    rf_gl.BindRenderbuffer(GL_RENDERBUFFER, rbo);
    rf_gl.RenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT24, size, size);
    rf_gl.FramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, rbo);

    // Create a prefiltered HDR environment map
    rf_gl.GenTextures(1, &prefilter.id);
    rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, prefilter.id);
    for (unsigned int i = 0; i < 6; i++)
    {
        rf_gl.TexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, 0, GL_RGB16F, size, size, 0, GL_RGB, GL_FLOAT, NULL);
    }

    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    rf_gl.TexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

    // Generate mipmaps for the prefiltered HDR texture
    rf_gl.GenerateMipmap(GL_TEXTURE_CUBE_MAP);

    // Create rf_ctx->gl_ctx.projection (transposed) and different views for each face
    rf_mat fbo_projection = rf_mat_perspective(90.0 * RF_DEG2RAD, 1.0, 0.01, 1000.0);
    rf_mat fbo_views[6] = {
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {1.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {-1.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, 1.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, 1.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, -1.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, 1.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f}),
            rf_mat_look_at((rf_vec3) {0.0f, 0.0f, 0.0f}, (rf_vec3) {0.0f, 0.0f, -1.0f}, (rf_vec3) {0.0f, -1.0f, 0.0f})
    };

    // Prefilter HDR and store data into mipmap levels
    rf_gl.UseProgram(shader.id);
    rf_gl.ActiveTexture(GL_TEXTURE0);
    rf_gl.BindTexture(GL_TEXTURE_CUBE_MAP, cubemap.id);
    rf_gfx_set_shader_value_matrix(shader, shader.locs[RF_LOC_MATRIX_PROJECTION], fbo_projection);

    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, fbo);

#define MAX_MIPMAP_LEVELS   5   // Max number of prefilter texture mipmaps

    for (rf_int mip = 0; mip < MAX_MIPMAP_LEVELS; mip++)
    {
        // Resize framebuffer according to mip-level size.
        unsigned int mip_width  = size*(int)powf(0.5f, (float)mip);
        unsigned int mip_height = size*(int)powf(0.5f, (float)mip);

        rf_gl.BindRenderbuffer(GL_RENDERBUFFER, rbo);
        rf_gl.RenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT24, mip_width, mip_height);
        rf_gl.Viewport(0, 0, mip_width, mip_height);

        float roughness = (float)mip/(float)(MAX_MIPMAP_LEVELS - 1);
        rf_gl.Uniform1f(roughness_loc, roughness);

        for (rf_int i = 0; i < 6; i++)
        {
            rf_gfx_set_shader_value_matrix(shader, shader.locs[RF_LOC_MATRIX_VIEW], fbo_views[i]);
            rf_gl.FramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_CUBE_MAP_POSITIVE_X + i, prefilter.id, mip);
            rf_gl.Clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
            rf_gen_draw_cube();
        }
    }

    // Unbind framebuffer and textures
    rf_gl.BindFramebuffer(GL_FRAMEBUFFER, 0);

    // Reset viewport dimensions to default
    rf_gl.Viewport(0, 0, rf_ctx.framebuffer_width, rf_ctx.framebuffer_height);

    prefilter.width = size;
    prefilter.height = size;
    //prefilter.mipmaps = 1 + (int)floor(log(size)/log(2));
    //prefilter.format = UNCOMPRESSED_R16G16B16;

    return prefilter;
}